

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

void __thiscall FConfigFile::MoveSectionToStart(FConfigFile *this,char *name)

{
  FConfigSection *pFVar1;
  bool bVar2;
  FConfigSection **local_28;
  FConfigSection **prevsec;
  FConfigSection *section;
  char *name_local;
  FConfigFile *this_local;
  
  pFVar1 = FindSection(this,name);
  if (pFVar1 != (FConfigSection *)0x0) {
    local_28 = &this->Sections;
    while( true ) {
      bVar2 = false;
      if (*local_28 != (FConfigSection *)0x0) {
        bVar2 = *local_28 != pFVar1;
      }
      if (!bVar2) break;
      local_28 = &(*local_28)->Next;
    }
    *local_28 = pFVar1->Next;
    pFVar1->Next = this->Sections;
    this->Sections = pFVar1;
    if (this->LastSectionPtr == &pFVar1->Next) {
      this->LastSectionPtr = local_28;
    }
  }
  return;
}

Assistant:

void FConfigFile::MoveSectionToStart (const char *name)
{
	FConfigSection *section = FindSection (name);

	if (section != NULL)
	{
		FConfigSection **prevsec = &Sections;
		while (*prevsec != NULL && *prevsec != section)
		{
			prevsec = &((*prevsec)->Next);
		}
		*prevsec = section->Next;
		section->Next = Sections;
		Sections = section;
		if (LastSectionPtr == &section->Next)
		{
			LastSectionPtr = prevsec;
		}
	}
}